

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void Ssw_RarManSimulate(Ssw_RarMan_t *p,Vec_Int_t *vInit,int fUpdate,int fFirst)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  word *pwVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Ptr_t *vCands;
  Aig_Obj_t *pAVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  Aig_Man_t *pAVar18;
  
  Ssw_RarManInitialize(p,vInit);
  p->vUpdConst->nSize = 0;
  p->vUpdClass->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  pAVar18 = p->pAig;
  if ((fUpdate != 0) && (pVVar8 = pAVar18->vCis, 0 < pVVar8->nSize)) {
    lVar12 = 0;
    do {
      if (pAVar18->pReprs != (Aig_Obj_t **)0x0) {
        pAVar10 = (Aig_Obj_t *)pVVar8->pArray[lVar12];
        pAVar2 = pAVar18->pReprs[pAVar10->Id];
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (pAVar2->TravId != pAVar18->nTravIds)) {
          iVar6 = Ssw_RarManObjsAreEqual(p,pAVar10,pAVar2);
          pAVar18 = p->pAig;
          if (iVar6 == 0) {
            if (pAVar2 == pAVar18->pConst1) {
              pVVar8 = p->vUpdConst;
              uVar17 = pVVar8->nSize;
              if (uVar17 == pVVar8->nCap) {
                if ((int)uVar17 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar17 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar17 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar17 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              ppvVar9[iVar6] = pAVar10;
              pAVar18 = p->pAig;
            }
            else {
              pVVar8 = p->vUpdClass;
              uVar17 = pVVar8->nSize;
              if (uVar17 == pVVar8->nCap) {
                if ((int)uVar17 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar17 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar17 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar17 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              ppvVar9[iVar6] = pAVar2;
              pAVar18 = p->pAig;
              pAVar2->TravId = pAVar18->nTravIds;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pAVar18->vCis;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pAVar18->vObjs;
  uVar17 = pVVar8->nSize;
  uVar15 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    lVar12 = 0;
    do {
      pAVar10 = (Aig_Obj_t *)pVVar8->pArray[lVar12];
      if ((pAVar10 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar10->field_0x18 & 7) - 7)) {
        iVar6 = pAVar10->Id;
        iVar7 = (int)uVar15;
        if (iVar7 <= iVar6) goto LAB_006ae89b;
        pAVar2 = pAVar10->pFanin0;
        if (pAVar2 == (Aig_Obj_t *)0x0) {
          iVar13 = -1;
        }
        else {
          iVar13 = *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24);
        }
        if (iVar7 <= iVar13) goto LAB_006ae89b;
        pAVar3 = pAVar10->pFanin1;
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          iVar14 = -1;
        }
        else {
          iVar14 = *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24);
        }
        if (iVar7 <= iVar14) goto LAB_006ae89b;
        uVar17 = p->pPars->nWords;
        if (0 < (int)uVar17) {
          pwVar4 = p->pObjData;
          uVar15 = 0;
          do {
            pwVar4[(long)(int)(iVar6 * uVar17) + uVar15] =
                 (pwVar4[(long)(int)(iVar14 * uVar17) + uVar15] ^ -(ulong)((uint)pAVar3 & 1)) &
                 (pwVar4[(long)(int)(iVar13 * uVar17) + uVar15] ^ -(ulong)((uint)pAVar2 & 1));
            uVar15 = uVar15 + 1;
          } while (uVar17 != uVar15);
        }
        if ((((fUpdate != 0) && (pAVar18->pReprs != (Aig_Obj_t **)0x0)) &&
            (pAVar2 = pAVar18->pReprs[iVar6], pAVar2 != (Aig_Obj_t *)0x0)) &&
           (pAVar2->TravId != pAVar18->nTravIds)) {
          iVar6 = Ssw_RarManObjsAreEqual(p,pAVar10,pAVar2);
          pAVar18 = p->pAig;
          if (iVar6 == 0) {
            if (pAVar2 == pAVar18->pConst1) {
              pVVar8 = p->vUpdConst;
              uVar17 = pVVar8->nSize;
              if (uVar17 == pVVar8->nCap) {
                if ((int)uVar17 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar17 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar17 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar17 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              ppvVar9[iVar6] = pAVar10;
              pAVar18 = p->pAig;
            }
            else {
              pVVar8 = p->vUpdClass;
              uVar17 = pVVar8->nSize;
              if (uVar17 == pVVar8->nCap) {
                if ((int)uVar17 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar17 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar17 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar17 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              ppvVar9[iVar6] = pAVar2;
              pAVar18 = p->pAig;
              pAVar2->TravId = pAVar18->nTravIds;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pAVar18->vObjs;
      uVar17 = pVVar8->nSize;
      uVar15 = (ulong)(int)uVar17;
    } while (lVar12 < (long)uVar15);
  }
  lVar12 = (long)pAVar18->vCos->nSize;
  if (0 < lVar12) {
    ppvVar9 = pAVar18->vCos->pArray;
    lVar11 = 0;
    do {
      pvVar5 = ppvVar9[lVar11];
      iVar6 = *(int *)((long)pvVar5 + 0x24);
      if ((int)uVar17 <= iVar6) {
LAB_006ae89b:
        __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                      ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
      }
      uVar15 = *(ulong *)((long)pvVar5 + 8);
      if (uVar15 == 0) {
        iVar7 = -1;
      }
      else {
        iVar7 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24);
      }
      if ((int)uVar17 <= iVar7) goto LAB_006ae89b;
      uVar1 = p->pPars->nWords;
      if (0 < (int)uVar1) {
        pwVar4 = p->pObjData;
        uVar16 = 0;
        do {
          pwVar4[(long)(int)(iVar6 * uVar1) + uVar16] =
               pwVar4[(long)(int)(iVar7 * uVar1) + uVar16] ^ -(ulong)((uint)uVar15 & 1);
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar12);
  }
  if (fUpdate == 0) {
    return;
  }
  if (fFirst == 0) {
    Ssw_ClassesRefineConst1Group(p->ppClasses,p->vUpdConst,1);
    Ssw_ClassesRefineGroup(p->ppClasses,p->vUpdClass,1);
    return;
  }
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  vCands->pArray = ppvVar9;
  if ((int)uVar17 < 1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    uVar15 = 1000;
    lVar12 = 0;
    do {
      pvVar5 = pVVar8->pArray[lVar12];
      if (pvVar5 != (void *)0x0) {
        if (pAVar18->pReprs == (Aig_Obj_t **)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = pAVar18->pReprs[*(int *)((long)pvVar5 + 0x24)];
        }
        if (pAVar10 == pAVar18->pConst1) {
          iVar7 = (int)uVar15;
          if (iVar6 == iVar7) {
            if (iVar7 < 0x10) {
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,0x80);
              }
              vCands->pArray = ppvVar9;
              vCands->nCap = 0x10;
              uVar15 = 0x10;
            }
            else {
              uVar15 = (ulong)(uint)(iVar7 * 2);
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(uVar15 * 8);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,uVar15 * 8);
              }
              vCands->pArray = ppvVar9;
              vCands->nCap = iVar7 * 2;
            }
          }
          else {
            ppvVar9 = vCands->pArray;
          }
          lVar11 = (long)iVar6;
          iVar6 = iVar6 + 1;
          vCands->nSize = iVar6;
          ppvVar9[lVar11] = pvVar5;
          pAVar18 = p->pAig;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pAVar18->vObjs;
    } while (lVar12 < pVVar8->nSize);
  }
  iVar7 = Ssw_ClassesCand1Num(p->ppClasses);
  if (iVar6 != iVar7) {
    __assert_fail("Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x2d7,"void Ssw_RarManSimulate(Ssw_RarMan_t *, Vec_Int_t *, int, int)");
  }
  Ssw_ClassesPrepareRehash(p->ppClasses,vCands,0);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
  }
  free(vCands);
  return;
}

Assistant:

void Ssw_RarManSimulate( Ssw_RarMan_t * p, Vec_Int_t * vInit, int fUpdate, int fFirst )
{
    Aig_Obj_t * pObj, * pRepr;
    word * pSim, * pSim0, * pSim1;
    word Flip, Flip0, Flip1;
    int w, i;
    // initialize
    Ssw_RarManInitialize( p, vInit );
    Vec_PtrClear( p->vUpdConst );
    Vec_PtrClear( p->vUpdClass );
    Aig_ManIncrementTravId( p->pAig );
    // check comb inputs
    if ( fUpdate )
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // simulate
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        pSim1 = Ssw_RarObjSim( p, Aig_ObjFaninId1(pObj) );
        Flip0 = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        Flip1 = Aig_ObjFaninC1(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = (Flip0 ^ pSim0[w]) & (Flip1 ^ pSim1[w]);


        if ( !fUpdate )
            continue;
        // check classes
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // transfer to POs
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        Flip  = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Flip ^ pSim0[w];
    }
    // refine classes
    if ( fUpdate )
    {
        if ( fFirst )
        {
            Vec_Ptr_t * vCands = Vec_PtrAlloc( 1000 );
            Aig_ManForEachObj( p->pAig, pObj, i )
                if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                    Vec_PtrPush( vCands, pObj );
            assert( Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses) );
            Ssw_ClassesPrepareRehash( p->ppClasses, vCands, 0 );
            Vec_PtrFree( vCands );
        }
        else
        {
            Ssw_ClassesRefineConst1Group( p->ppClasses, p->vUpdConst, 1 );
            Ssw_ClassesRefineGroup( p->ppClasses, p->vUpdClass, 1 );
        }
    }
}